

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::PolyOffsetBuilder::DoSquare(PolyOffsetBuilder *this,double mul)

{
  double dVar1;
  double dVar2;
  long lVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long64 lVar7;
  long64 lVar8;
  double dVar9;
  IntPoint local_70;
  IntPoint local_60;
  double local_50;
  double dx;
  double a2;
  double a1;
  IntPoint pt2;
  IntPoint pt1;
  double mul_local;
  PolyOffsetBuilder *this_local;
  
  pvVar4 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](&this->m_p,this->m_i);
  pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (pvVar4,this->m_j);
  lVar3 = pvVar5->X;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_k);
  lVar7 = Round(pvVar6->X * this->m_delta + (double)lVar3);
  pvVar4 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](&this->m_p,this->m_i);
  pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (pvVar4,this->m_j);
  lVar3 = pvVar5->Y;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_k);
  lVar8 = Round(pvVar6->Y * this->m_delta + (double)lVar3);
  IntPoint::IntPoint((IntPoint *)&pt2.Y,lVar7,lVar8);
  pvVar4 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](&this->m_p,this->m_i);
  pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (pvVar4,this->m_j);
  lVar3 = pvVar5->X;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_j);
  lVar7 = Round(pvVar6->X * this->m_delta + (double)lVar3);
  pvVar4 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](&this->m_p,this->m_i);
  pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (pvVar4,this->m_j);
  lVar3 = pvVar5->Y;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_j);
  lVar8 = Round(pvVar6->Y * this->m_delta + (double)lVar3);
  IntPoint::IntPoint((IntPoint *)&a1,lVar7,lVar8);
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_k);
  dVar9 = pvVar6->X;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_j);
  dVar1 = pvVar6->Y;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_j);
  dVar2 = pvVar6->X;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_k);
  if ((dVar9 * dVar1 + -(dVar2 * pvVar6->Y)) * this->m_delta < 0.0) {
    AddPoint(this,(IntPoint *)&pt2.Y);
    pvVar4 = std::
             vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ::operator[](&this->m_p,this->m_i);
    pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (pvVar4,this->m_j);
    AddPoint(this,pvVar5);
    AddPoint(this,(IntPoint *)&a1);
  }
  else {
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_k);
    dVar9 = pvVar6->Y;
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_k);
    a2 = atan2(dVar9,pvVar6->X);
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_j);
    dVar9 = pvVar6->Y;
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_j);
    dx = atan2(-dVar9,-pvVar6->X);
    a2 = ABS(dx - a2);
    if (3.141592653589793 < a2) {
      a2 = 6.283185307179586 - a2;
    }
    local_50 = tan((3.141592653589793 - a2) / 4.0);
    local_50 = local_50 * ABS(this->m_delta * mul);
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_k);
    dVar9 = -pvVar6->Y * local_50;
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_k);
    IntPoint::IntPoint(&local_60,(long)(dVar9 + (double)pt2.Y),
                       (long)(pvVar6->X * local_50 + (double)pt1.X));
    pt2.Y = local_60.X;
    AddPoint(this,(IntPoint *)&pt2.Y);
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_j);
    dVar9 = pvVar6->Y * local_50;
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_j);
    IntPoint::IntPoint(&local_70,(long)(dVar9 + (double)(long)a1),
                       (long)(-pvVar6->X * local_50 + (double)pt2.X));
    a1 = (double)local_70.X;
    pt2.X = local_70.Y;
    AddPoint(this,(IntPoint *)&a1);
  }
  return;
}

Assistant:

void DoSquare(double mul = 1.0)
{
    IntPoint pt1 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_k].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_k].Y * m_delta));
    IntPoint pt2 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_j].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_j].Y * m_delta));
    if ((normals[m_k].X * normals[m_j].Y - normals[m_j].X * normals[m_k].Y) * m_delta >= 0)
    {
      double a1 = std::atan2(normals[m_k].Y, normals[m_k].X);
      double a2 = std::atan2(-normals[m_j].Y, -normals[m_j].X);
      a1 = std::fabs(a2 - a1);
      if (a1 > pi) a1 = pi * 2 - a1;
      double dx = std::tan((pi - a1)/4) * std::fabs(m_delta * mul);
      pt1 = IntPoint((long64)(pt1.X -normals[m_k].Y * dx),
        (long64)(pt1.Y + normals[m_k].X * dx));
      AddPoint(pt1);
      pt2 = IntPoint((long64)(pt2.X + normals[m_j].Y * dx),
        (long64)(pt2.Y -normals[m_j].X * dx));
      AddPoint(pt2);
    }
    else
    {
      AddPoint(pt1);
      AddPoint(m_p[m_i][m_j]);
      AddPoint(pt2);
    }
}